

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  allocator local_289;
  string local_288;
  int argc_local;
  string fileName;
  TimeUsage timer;
  Steiner st;
  
  argc_local = argc;
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x113280) = 0;
  TimeUsage::TimeUsage(&timer);
  bVar1 = handleArgument(&argc_local,argv);
  if (bVar1) {
    std::__cxx11::string::string((string *)&fileName,argv[1],(allocator *)&st);
    Steiner::Steiner(&st);
    std::__cxx11::string::string((string *)&local_288,argv[1],&local_289);
    Steiner::parse(&st,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    Steiner::solve(&st);
    if (gDoplot == true) {
      Steiner::plot(&st,&plotName_abi_cxx11_);
    }
    if (gOutfile == true) {
      Steiner::outfile(&st,&outfileName_abi_cxx11_);
    }
    std::__cxx11::string::string((string *)&local_288,"Steiner",&local_289);
    iVar2 = 0;
    TimeUsage::showUsage(&timer,&local_288,FULL);
    std::__cxx11::string::~string((string *)&local_288);
    Steiner::~Steiner(&st);
    std::__cxx11::string::~string((string *)&fileName);
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv) {
  ios::sync_with_stdio(false);
  cin.tie(0);
  TimeUsage timer;
  if (!handleArgument(argc, argv)) return -1;
  string fileName = argv[1];
  Steiner st;
  st.parse(argv[1]);
  st.solve();
#ifdef VERBOSE
  timer.showUsage("solve", TimeUsage::PARTIAL);
  timer.start(TimeUsage::PARTIAL);
#endif
  if (gDoplot) {
    st.plot(plotName);
#ifdef VERBOSE    
    timer.showUsage("plot", TimeUsage::PARTIAL);
    timer.start(TimeUsage::PARTIAL);
#endif
  }
  if (gOutfile) {
    st.outfile(outfileName);
#ifdef VERBOSE
    timer.showUsage("outfile", TimeUsage::PARTIAL);
    timer.start(TimeUsage::PARTIAL);
#endif
  }
  timer.showUsage("Steiner", TimeUsage::FULL);
  return 0;
}